

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_stdout_and_stderr_to_file(void)

{
  int iVar1;
  uv_stdio_flags file_00;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  char *local_270;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t buf;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  uv_os_fd_t file;
  int r;
  
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stdio[2].data,"stdout_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x184,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  file_00 = (uv_stdio_flags)fs_req.cb;
  uv_fs_req_cleanup((uv_fs_t *)&stdio[2].data);
  options.stdio = (uv_stdio_container_t *)&buf.len;
  buf.len._0_4_ = 0;
  stdio[0].data.file = 2;
  stdio[1].data.file = 2;
  options.stdio_count = 3;
  stdio[1].flags = file_00;
  stdio[2].flags = file_00;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x191,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x194,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x196,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x197,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  uVar3 = uv_buf_init(output,0x400);
  eval_a_5 = (int64_t)uVar3.base;
  eval_a = eval_a_5;
  local_270 = (char *)uVar3.len;
  buf.base = local_270;
  iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)&stdio[2].data,file_00,(uv_buf_t *)&eval_a,1,0,
                     (uv_fs_cb)0x0);
  if ((long)iVar1 != 0x1b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x19b,"27","==","r",0x1b,"==",(long)iVar1);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&stdio[2].data);
  iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&stdio[2].data,file_00,(uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x19f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&stdio[2].data);
  printf("output is: %s",output);
  iVar1 = strcmp("hello world\nhello errworld\n",output);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x1a3,"strcmp(\"hello world\\nhello errworld\\n\", output)","==","0",(long)iVar1,"==",0
           );
    abort();
  }
  unlink("stdout_file");
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x1a8,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file) {
  int r;
  uv_os_fd_t file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", UV_FS_O_CREAT | UV_FS_O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT_EQ(27, r);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\nhello errworld\n", output));

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}